

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_method_post.c
# Opt level: O1

void nhr_request_generate_new_boundary(nhr_request r)

{
  int iVar1;
  time_t tVar2;
  char *pcVar3;
  long lVar4;
  char boundary [12];
  char local_24 [12];
  
  lVar4 = 0;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  do {
    iVar1 = rand();
    local_24[lVar4] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[iVar1 % 0x3e]
    ;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xc);
  nhr_string_delete_clean(&r->boundary);
  pcVar3 = nhr_string_copy_len(local_24,0xc);
  r->boundary = pcVar3;
  return;
}

Assistant:

void nhr_request_generate_new_boundary(nhr_request r) {
    static const char charset[62] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";
    char boundary[NHR_POST_BOUNDARY_LEN];
    size_t i;
    srand((unsigned)time(NULL));
    for (i = 0; i < NHR_POST_BOUNDARY_LEN; i++) {
        boundary[i] = charset[rand() % 62];
    }
    nhr_string_delete_clean(&r->boundary);
    r->boundary = nhr_string_copy_len(boundary, NHR_POST_BOUNDARY_LEN);
}